

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O1

void __thiscall
amrex::MLNodeLinOp::define
          (MLNodeLinOp *this,Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *a_geom,
          Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *a_grids,
          Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *a_dmap,
          LPInfo *a_info,
          Vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
          *a_factory,int a_eb_limit_coarsening)

{
  Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  *pVVar1;
  int ncomp;
  long lVar2;
  long *plVar3;
  FabArray<amrex::IArrayBox> *this_00;
  int *piVar4;
  DistributionMapping *pDVar5;
  pointer puVar6;
  tuple<amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_> tVar7;
  BoxArray *pBVar8;
  pointer puVar9;
  tuple<amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_> tVar10;
  undefined8 uVar11;
  uint uVar12;
  iMultiFab *piVar13;
  iMultiFab *piVar14;
  __uniq_ptr_data<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>,_true,_true> _Var15;
  __uniq_ptr_data<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>,_true,_true>
  this_01;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long local_2d0;
  IntVect local_2c8;
  Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  *local_2b8;
  IntVect local_2ac;
  Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
  *local_2a0;
  IntVect local_294;
  undefined1 local_288 [104];
  BoxArray local_220;
  undefined1 local_1b8 [392];
  
  MLLinOp::define(&this->super_MLLinOp,a_geom,a_grids,a_dmap,a_info,a_factory,
                  0 < a_eb_limit_coarsening);
  if ((uint)(this->super_MLLinOp).info.hidden_direction < 3) {
    Assert_host("!hasHiddenDimension()",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLNodeLinOp.cpp"
                ,0x2a,"\"Nodal solver cannot have any hidden dimensions\"");
  }
  local_2a0 = &this->m_dirichlet_mask;
  std::
  vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
  ::resize(&local_2a0->
            super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
           ,(long)(this->super_MLLinOp).m_num_amr_levels);
  if (0 < (this->super_MLLinOp).m_num_amr_levels) {
    lVar17 = 0;
    do {
      std::
      vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
      ::resize(&(this->m_dirichlet_mask).
                super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                .
                super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar17].
                super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               ,(long)(this->super_MLLinOp).m_num_mg_levels.super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[lVar17]);
      if (0 < (this->super_MLLinOp).m_num_mg_levels.super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [lVar17]) {
        local_2b8 = (Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                     *)(lVar17 * 0x18);
        local_2d0 = 0;
        lVar18 = 0;
        lVar19 = 0;
        do {
          pVVar1 = local_2b8;
          local_220.m_bat._0_8_ = 0x100000001;
          local_220.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)1;
          convert((BoxArray *)local_1b8,
                  (BoxArray *)
                  (*(long *)((long)&(((this->super_MLLinOp).m_grids.
                                      super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                      .
                                      super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>)
                                    .
                                    super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                    ._M_impl.super__Vector_impl_data._M_start + (long)local_2b8) +
                  lVar18),(IntVect *)&local_220);
          lVar2 = *(long *)((long)&(((this->super_MLLinOp).m_dmap.
                                     super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                     .
                                     super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                   ).
                                   super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                   ._M_impl.super__Vector_impl_data._M_start + (long)pVVar1);
          piVar13 = (iMultiFab *)operator_new(0x180);
          local_288._0_8_ = (_func_int **)0x1;
          local_288._24_8_ = (pointer)0x0;
          local_288._32_8_ = (pointer)0x0;
          local_288._8_8_ = (Arena *)0x0;
          local_288._16_8_ = (pointer)0x0;
          local_2c8.vect._0_8_ = &PTR__FabFactory_008384c0;
          iMultiFab::iMultiFab
                    (piVar13,(BoxArray *)local_1b8,(DistributionMapping *)(lVar2 + local_2d0),1,0,
                     (MFInfo *)local_288,(FabFactory<amrex::IArrayBox> *)&local_2c8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_288 + 0x10));
          lVar2 = *(long *)&(local_2a0->
                            super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                            ).
                            super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar17].
                            super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                            .
                            super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
          ;
          plVar3 = *(long **)(lVar2 + lVar19 * 8);
          *(iMultiFab **)(lVar2 + lVar19 * 8) = piVar13;
          if (plVar3 != (long *)0x0) {
            (**(code **)(*plVar3 + 8))();
          }
          BoxArray::~BoxArray((BoxArray *)local_1b8);
          this_00 = *(FabArray<amrex::IArrayBox> **)
                     (*(long *)&(this->m_dirichlet_mask).
                                super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                .
                                super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar17].
                                super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                                .
                                super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                     + lVar19 * 8);
          FabArray<amrex::IArrayBox>::setVal<amrex::IArrayBox,_0>
                    (this_00,0,0,(this_00->super_FabArrayBase).n_comp,
                     &(this_00->super_FabArrayBase).n_grow);
          lVar19 = lVar19 + 1;
          lVar18 = lVar18 + 0x68;
          local_2d0 = local_2d0 + 0x10;
        } while (lVar19 < (this->super_MLLinOp).m_num_mg_levels.
                          super_vector<int,_std::allocator<int>_>.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar17]);
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < (this->super_MLLinOp).m_num_amr_levels);
  }
  makeOwnerMask((MLNodeLinOp *)local_1b8,
                *(BoxArray **)
                 &(((this->super_MLLinOp).m_grids.
                    super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
                *(DistributionMapping **)
                 &(((this->super_MLLinOp).m_dmap.
                    super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                  ).
                  super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                ,*(Geometry **)
                  &(((this->super_MLLinOp).m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                   super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>);
  uVar11 = local_1b8._0_8_;
  local_1b8._0_8_ = (iMultiFab *)0x0;
  piVar13 = (this->m_owner_mask_top)._M_t.
            super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
            super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
            super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl;
  (this->m_owner_mask_top)._M_t.
  super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
  super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl = (iMultiFab *)uVar11;
  if (piVar13 != (iMultiFab *)0x0) {
    (**(code **)(*(long *)&(piVar13->super_FabArray<amrex::IArrayBox>).super_FabArrayBase + 8))();
  }
  if ((iMultiFab *)local_1b8._0_8_ != (iMultiFab *)0x0) {
    (*(((FabArray<amrex::IArrayBox> *)local_1b8._0_8_)->super_FabArrayBase)._vptr_FabArrayBase[1])()
    ;
  }
  piVar4 = (this->super_MLLinOp).m_num_mg_levels.super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if (*piVar4 == 1) {
    piVar13 = (this->m_owner_mask_top)._M_t.
              super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
              super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
              super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl;
    ncomp = (piVar13->super_FabArray<amrex::IArrayBox>).super_FabArrayBase.n_comp;
    piVar14 = (iMultiFab *)operator_new(0x180);
    iMultiFab::iMultiFab(piVar14,piVar13,make_alias,0,ncomp);
    piVar13 = (this->m_owner_mask_bottom)._M_t.
              super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
              super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
              super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl;
    (this->m_owner_mask_bottom)._M_t.
    super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
    super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl = piVar14;
  }
  else {
    lVar17 = (long)*piVar4 + -1;
    makeOwnerMask((MLNodeLinOp *)local_1b8,
                  (BoxArray *)
                  (lVar17 * 0x68 +
                  *(long *)&(((this->super_MLLinOp).m_grids.
                              super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                              .
                              super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                            super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>),
                  (DistributionMapping *)
                  (lVar17 * 0x10 +
                  *(long *)&(((this->super_MLLinOp).m_dmap.
                              super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                              .
                              super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                            ).
                            super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                  ),(Geometry *)
                    (lVar17 * 200 +
                    *(long *)&(((this->super_MLLinOp).m_geom.
                                super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                .
                                super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>)
                 );
    uVar11 = local_1b8._0_8_;
    local_1b8._0_8_ = (iMultiFab *)0x0;
    piVar14 = (this->m_owner_mask_bottom)._M_t.
              super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
              super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
              super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl;
    (this->m_owner_mask_bottom)._M_t.
    super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
    super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl = (iMultiFab *)uVar11;
    piVar13 = (iMultiFab *)local_1b8._0_8_;
    if (piVar14 != (iMultiFab *)0x0) {
      (**(code **)(*(long *)&(piVar14->super_FabArray<amrex::IArrayBox>).super_FabArrayBase + 8))();
      piVar13 = (iMultiFab *)local_1b8._0_8_;
    }
  }
  if (piVar13 != (iMultiFab *)0x0) {
    (**(code **)((long)(piVar13->super_FabArray<amrex::IArrayBox>).super_FabArrayBase.
                       _vptr_FabArrayBase + 8))();
  }
  pVVar1 = &this->m_cc_fine_mask;
  std::
  vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ::resize(&pVVar1->
            super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
           ,(long)(this->super_MLLinOp).m_num_amr_levels);
  local_2b8 = &this->m_nd_fine_mask;
  std::
  vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ::resize(&local_2b8->
            super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
           ,(long)(this->super_MLLinOp).m_num_amr_levels);
  std::
  vector<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
  ::resize(&(this->m_has_fine_bndry).
            super_vector<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
           ,(long)(this->super_MLLinOp).m_num_amr_levels);
  uVar12 = (this->super_MLLinOp).m_num_amr_levels;
  uVar16 = (ulong)uVar12;
  if (0 < (int)uVar12) {
    lVar18 = 0;
    lVar17 = 0;
    do {
      if (lVar17 < (int)uVar16 + -1) {
        local_220.m_bat._0_8_ = 0x100000001;
        local_220.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)1;
        convert((BoxArray *)local_1b8,
                *(BoxArray **)
                 ((long)&(((this->super_MLLinOp).m_grids.
                           super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                         super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar18),(IntVect *)&local_220);
        pDVar5 = *(DistributionMapping **)
                  ((long)&(((this->super_MLLinOp).m_dmap.
                            super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                          ).
                          super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar18);
        _Var15.super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
        super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
        super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
             (__uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>)
             operator_new(0x180);
        local_288._0_8_ = (_func_int **)0x1;
        local_288._24_8_ = (pointer)0x0;
        local_288._32_8_ = (pointer)0x0;
        local_288._8_8_ = (Arena *)0x0;
        local_288._16_8_ = (pointer)0x0;
        local_2c8.vect._0_8_ = &PTR__FabFactory_008384c0;
        iMultiFab::iMultiFab
                  ((iMultiFab *)
                   _Var15.
                   super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                   .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,
                   (BoxArray *)local_1b8,pDVar5,1,0,(MFInfo *)local_288,
                   (FabFactory<amrex::IArrayBox> *)&local_2c8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_288 + 0x10));
        puVar6 = (local_2b8->
                 super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                 ).
                 super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        tVar7.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
        super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
             *(_Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_> *)
              &puVar6[lVar17]._M_t.
               super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>;
        puVar6[lVar17]._M_t.
        super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> =
             _Var15.super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
             .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl;
        if (tVar7.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
            .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl !=
            (_Head_base<0UL,_amrex::iMultiFab_*,_false>)0x0) {
          (**(code **)(*(long *)tVar7.
                                super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl + 8))
                    ();
        }
        BoxArray::~BoxArray((BoxArray *)local_1b8);
        pBVar8 = *(BoxArray **)
                  ((long)&(((this->super_MLLinOp).m_grids.
                            super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                          super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar18);
        pDVar5 = *(DistributionMapping **)
                  ((long)&(((this->super_MLLinOp).m_dmap.
                            super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                          ).
                          super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar18);
        _Var15.super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
        super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
        super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
             (__uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>)
             operator_new(0x180);
        local_1b8._0_8_ = (iMultiFab *)0x1;
        local_1b8._24_8_ = 0;
        local_1b8._32_8_ = 0;
        local_1b8._8_8_ = 0;
        local_1b8._16_8_ = 0;
        local_288._0_8_ = &PTR__FabFactory_008384c0;
        iMultiFab::iMultiFab
                  ((iMultiFab *)
                   _Var15.
                   super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                   .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,pBVar8,pDVar5,1,1,
                   (MFInfo *)local_1b8,(FabFactory<amrex::IArrayBox> *)local_288);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b8 + 0x10));
        puVar6 = (pVVar1->
                 super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                 ).
                 super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        tVar7.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
        super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
             *(_Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_> *)
              &puVar6[lVar17]._M_t.
               super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>;
        puVar6[lVar17]._M_t.
        super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> =
             _Var15.super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
             .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl;
        if (tVar7.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
            .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl !=
            (_Head_base<0UL,_amrex::iMultiFab_*,_false>)0x0) {
          (**(code **)(*(long *)tVar7.
                                super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl + 8))
                    ();
        }
      }
      else {
        pBVar8 = *(BoxArray **)
                  ((long)&(((this->super_MLLinOp).m_grids.
                            super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                          super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar18);
        pDVar5 = *(DistributionMapping **)
                  ((long)&(((this->super_MLLinOp).m_dmap.
                            super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                          ).
                          super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar18);
        local_1b8._16_8_ = 0;
        local_1b8._24_8_ = 0;
        local_1b8._0_8_ = (iMultiFab *)0x0;
        local_1b8._8_8_ = 0;
        local_1b8._32_8_ = 0;
        _Var15.super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
        super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
        super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
             (__uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>)
             operator_new(0x180);
        local_288._0_8_ = &PTR__FabFactory_008384c0;
        iMultiFab::iMultiFab
                  ((iMultiFab *)
                   _Var15.
                   super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                   .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,pBVar8,pDVar5,1,1,
                   (MFInfo *)local_1b8,(FabFactory<amrex::IArrayBox> *)local_288);
        puVar6 = (pVVar1->
                 super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                 ).
                 super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        tVar7.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
        super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
             *(_Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_> *)
              &puVar6[lVar17]._M_t.
               super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>;
        puVar6[lVar17]._M_t.
        super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> =
             _Var15.super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
             .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl;
        if (tVar7.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
            .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl !=
            (_Head_base<0UL,_amrex::iMultiFab_*,_false>)0x0) {
          (**(code **)(*(long *)tVar7.
                                super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl + 8))
                    ();
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b8 + 0x10));
      }
      pBVar8 = *(BoxArray **)
                ((long)&(((this->super_MLLinOp).m_grids.
                          super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                        super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar18);
      pDVar5 = *(DistributionMapping **)
                ((long)&(((this->super_MLLinOp).m_dmap.
                          super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                        ).
                        super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar18);
      this_01.
      super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>.
      _M_t.
      super__Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>
      .super__Head_base<0UL,_amrex::LayoutData<int>_*,_false>._M_head_impl =
           (__uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>)
           operator_new(0x110);
      LayoutData<int>::LayoutData
                ((LayoutData<int> *)
                 this_01.
                 super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>
                 .super__Head_base<0UL,_amrex::LayoutData<int>_*,_false>._M_head_impl,pBVar8,pDVar5)
      ;
      puVar9 = (this->m_has_fine_bndry).
               super_vector<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      tVar10.
      super__Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>
      .super__Head_base<0UL,_amrex::LayoutData<int>_*,_false>._M_head_impl =
           *(_Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>
             *)&puVar9[lVar17]._M_t.
                super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
      ;
      puVar9[lVar17]._M_t.
      super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_> =
           this_01.
           super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>
           .super__Head_base<0UL,_amrex::LayoutData<int>_*,_false>._M_head_impl;
      if (tVar10.
          super__Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>
          .super__Head_base<0UL,_amrex::LayoutData<int>_*,_false>._M_head_impl !=
          (_Head_base<0UL,_amrex::LayoutData<int>_*,_false>)0x0) {
        (**(code **)(*(long *)tVar10.
                              super__Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>
                              .super__Head_base<0UL,_amrex::LayoutData<int>_*,_false>._M_head_impl +
                    8))();
      }
      lVar17 = lVar17 + 1;
      uVar12 = (this->super_MLLinOp).m_num_amr_levels;
      uVar16 = (ulong)(int)uVar12;
      lVar18 = lVar18 + 0x18;
    } while (lVar17 < (long)uVar16);
  }
  std::
  vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ::resize(&(this->m_norm_fine_mask).
            super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
           ,(long)(int)(uVar12 - 1));
  if (1 < (this->super_MLLinOp).m_num_amr_levels) {
    lVar18 = 0;
    lVar17 = 0;
    do {
      local_2c8.vect[0] = 1;
      local_2c8.vect[1] = 1;
      local_2c8.vect[2] = 1;
      convert((BoxArray *)local_288,
              *(BoxArray **)
               ((long)&(((this->super_MLLinOp).m_grids.
                         super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl
                       .super__Vector_impl_data._M_start + lVar18),&local_2c8);
      pDVar5 = *(DistributionMapping **)
                ((long)&(((this->super_MLLinOp).m_dmap.
                          super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                        ).
                        super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar18);
      local_294.vect[0] = 1;
      local_294.vect[1] = 1;
      local_294.vect[2] = 1;
      convert(&local_220,
              *(BoxArray **)
               ((long)&(this->super_MLLinOp).m_grids.
                       super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1].
                       super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl
                       .super__Vector_impl_data._M_start + lVar18),&local_294);
      local_2ac.vect[0] =
           (this->super_MLLinOp).m_amr_ref_ratio.super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           [lVar17];
      local_2ac.vect[1] = local_2ac.vect[0];
      local_2ac.vect[2] = local_2ac.vect[0];
      makeFineMask((iMultiFab *)local_1b8,(BoxArray *)local_288,pDVar5,&local_220,&local_2ac,1,0);
      _Var15.super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
      super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
      super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
           (__uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>)
           operator_new(0x180);
      FabArray<amrex::IArrayBox>::FabArray
                ((FabArray<amrex::IArrayBox> *)
                 _Var15.
                 super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
                 super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,
                 (FabArray<amrex::IArrayBox> *)local_1b8);
      *(undefined ***)
       _Var15.super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
       super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
       super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl = &PTR__iMultiFab_00839008;
      puVar6 = (this->m_norm_fine_mask).
               super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      tVar7.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
      super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
           *(_Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_> *)
            &puVar6[lVar17]._M_t.
             super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>;
      puVar6[lVar17]._M_t.
      super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> =
           _Var15.super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>.
           _M_t.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
           super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl;
      if (tVar7.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
          super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl !=
          (_Head_base<0UL,_amrex::iMultiFab_*,_false>)0x0) {
        (**(code **)(*(long *)tVar7.
                              super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                              .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl + 8))()
        ;
      }
      lVar17 = lVar17 + 1;
      iMultiFab::~iMultiFab((iMultiFab *)local_1b8);
      BoxArray::~BoxArray(&local_220);
      BoxArray::~BoxArray((BoxArray *)local_288);
      lVar18 = lVar18 + 0x18;
    } while (lVar17 < (long)(this->super_MLLinOp).m_num_amr_levels + -1);
  }
  return;
}

Assistant:

void
MLNodeLinOp::define (const Vector<Geometry>& a_geom,
                     const Vector<BoxArray>& a_grids,
                     const Vector<DistributionMapping>& a_dmap,
                     const LPInfo& a_info,
                     const Vector<FabFactory<FArrayBox> const*>& a_factory,
                     int a_eb_limit_coarsening)
{
    bool eb_limit_coarsening;
    if (a_eb_limit_coarsening < 0) { // default
#if defined(AMREX_USE_HYPRE) && (AMREX_SPACEDIM > 1)
        eb_limit_coarsening = true;
#else
        eb_limit_coarsening = false;
#endif
    } else {
        eb_limit_coarsening = a_eb_limit_coarsening;
    }

    MLLinOp::define(a_geom, a_grids, a_dmap, a_info, a_factory, eb_limit_coarsening);

    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(!hasHiddenDimension(),
                                     "Nodal solver cannot have any hidden dimensions");

    m_dirichlet_mask.resize(m_num_amr_levels);
    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev) {
        m_dirichlet_mask[amrlev].resize(m_num_mg_levels[amrlev]);
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev)
        {
            m_dirichlet_mask[amrlev][mglev] = std::make_unique<iMultiFab>
                (amrex::convert(m_grids[amrlev][mglev],IntVect::TheNodeVector()),
                 m_dmap[amrlev][mglev], 1, 0);
            m_dirichlet_mask[amrlev][mglev]->setVal(0); // non-Dirichlet by default
        }
    }

    m_owner_mask_top = makeOwnerMask(m_grids[0][0],
                                      m_dmap[0][0],
                                      m_geom[0][0]);
    if (m_num_mg_levels[0] == 1) {
        m_owner_mask_bottom = std::make_unique<iMultiFab>(*m_owner_mask_top, amrex::make_alias, 0,
                                                          m_owner_mask_top->nComp());
    } else {
        m_owner_mask_bottom = makeOwnerMask(m_grids[0][m_num_mg_levels[0]-1],
                                             m_dmap[0][m_num_mg_levels[0]-1],
                                             m_geom[0][m_num_mg_levels[0]-1]);
    }

    m_cc_fine_mask.resize(m_num_amr_levels);
    m_nd_fine_mask.resize(m_num_amr_levels);
    m_has_fine_bndry.resize(m_num_amr_levels);
    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev)
    {
        if (amrlev < m_num_amr_levels-1)
        {
            m_nd_fine_mask[amrlev] = std::make_unique<iMultiFab>
                (amrex::convert(m_grids[amrlev][0],IntVect::TheNodeVector()),
                 m_dmap[amrlev][0], 1, 0);
            m_cc_fine_mask[amrlev] = std::make_unique<iMultiFab>
                (m_grids[amrlev][0], m_dmap[amrlev][0], 1, 1);
        } else {
            m_cc_fine_mask[amrlev] = std::make_unique<iMultiFab>
                (m_grids[amrlev][0], m_dmap[amrlev][0], 1, 1, MFInfo().SetAlloc(false));
        }
        m_has_fine_bndry[amrlev] = std::make_unique<LayoutData<int> >(m_grids[amrlev][0],
                                                                      m_dmap[amrlev][0]);
    }

    m_norm_fine_mask.resize(m_num_amr_levels-1);
    for (int amrlev = 0; amrlev < m_num_amr_levels-1; ++amrlev) {
        m_norm_fine_mask[amrlev] = std::make_unique<iMultiFab>
            (makeFineMask(amrex::convert(m_grids[amrlev][0], IntVect(1)), m_dmap[amrlev][0],
                          amrex::convert(m_grids[amrlev+1][0], IntVect(1)),
                          IntVect(m_amr_ref_ratio[amrlev]), 1, 0));
    }
}